

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseACOFile(filebuf *file)

{
  pointer paVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ushort uVar6;
  char buf [10];
  undefined2 local_3a;
  undefined1 local_38;
  undefined1 local_36;
  
  lVar2 = (**(code **)(*(long *)file + 0x40))(file,&local_3a,2);
  if (lVar2 == 2) {
    if ((ushort)(local_3a << 8 | local_3a >> 8) == 1) {
      lVar2 = (**(code **)(*(long *)file + 0x40))(file,&local_3a,2);
      if (lVar2 == 2) {
        uVar6 = local_3a << 8 | local_3a >> 8;
        if ((ushort)((ushort)options.nbPalettes * (ushort)options.nbColorsPerPal) < uVar6) {
          warning("ACO file contains %u colors, but there can only be %u; ignoring extra");
          uVar6 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
        }
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if (uVar6 == 0) {
          return;
        }
        uVar3 = 0;
        do {
          lVar2 = (**(code **)(*(long *)file + 0x40))(file,&local_3a,10);
          if (lVar2 != 10) {
            uVar4 = uVar3 + 1;
            pcVar5 = "Failed to read color #%u from palette file";
LAB_0010d06e:
            error(pcVar5,(ulong)uVar4);
            return;
          }
          if ((short)((uVar3 & 0xffff) % (uint)options.nbColorsPerPal) == 0) {
            if (options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
              _M_realloc_insert<>(&options.palSpec,
                                  (iterator)
                                  options.palSpec.
                                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              paVar1 = options.palSpec.
                       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              paVar1->_M_elems[0].red = '\0';
              paVar1->_M_elems[0].green = '\0';
              paVar1->_M_elems[0].blue = '\0';
              paVar1->_M_elems[0].alpha = '\0';
              paVar1->_M_elems[1].red = '\0';
              paVar1->_M_elems[1].green = '\0';
              paVar1->_M_elems[1].blue = '\0';
              paVar1->_M_elems[1].alpha = '\0';
              paVar1->_M_elems[2].red = '\0';
              paVar1->_M_elems[2].green = '\0';
              paVar1->_M_elems[2].blue = '\0';
              paVar1->_M_elems[2].alpha = '\0';
              paVar1->_M_elems[3].red = '\0';
              paVar1->_M_elems[3].green = '\0';
              paVar1->_M_elems[3].blue = '\0';
              paVar1->_M_elems[3].alpha = '\0';
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar4 = (uint)CONCAT11((undefined1)local_3a,local_3a._1_1_);
          if (uVar4 != 0) {
            switch(uVar4) {
            case 1:
              pcVar5 = "Unsupported color type (HSB) for ACO file";
              break;
            case 2:
              pcVar5 = "Unsupported color type (CMYK) for ACO file";
              break;
            default:
              pcVar5 = "Unknown color type (%u) for ACO file";
              goto LAB_0010d06e;
            case 7:
              pcVar5 = "Unsupported color type (lab) for ACO file";
              break;
            case 8:
              pcVar5 = "Unsupported color type (grayscale) for ACO file";
            }
            goto LAB_0010d008;
          }
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish[-1]._M_elems
          [(ushort)((uVar3 & 0xffff) % (uint)options.nbColorsPerPal)] =
               (Rgba)(CONCAT12(local_36,CONCAT11(local_38,(undefined1)local_3a)) | 0xff000000);
          uVar3 = uVar3 + 1;
          if (uVar6 == (ushort)uVar3) {
            return;
          }
        } while( true );
      }
      pcVar5 = "Couldn\'t read number of colors in palette file";
    }
    else {
      pcVar5 = "Palette file does not appear to be an ACO file";
    }
  }
  else {
    pcVar5 = "Couldn\'t read ACO file version";
  }
LAB_0010d008:
  error(pcVar5);
  return;
}

Assistant:

static void parseACOFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1055819
	// http://www.nomodes.com/aco.html

	char buf[10];

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read ACO file version");
		return;
	}
	if (readBE<uint16_t>(buf) != 1) {
		error("Palette file does not appear to be an ACO file");
		return;
	}

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read number of colors in palette file");
		return;
	}
	uint16_t nbColors = readBE<uint16_t>(buf);

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACO file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < nbColors; ++i) {
		if (file.sgetn(buf, 10) != 10) {
			error("Failed to read color #%" PRIu16 " from palette file", i + 1);
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}

		Rgba &color = options.palSpec.back()[i % options.nbColorsPerPal];
		uint16_t colorType = readBE<uint16_t>(buf);
		switch (colorType) {
		case 0: // RGB
			color = Rgba(buf[0], buf[2], buf[4], 0xFF);
			break;
		case 1: // HSB
			error("Unsupported color type (HSB) for ACO file");
			return;
		case 2: // CMYK
			error("Unsupported color type (CMYK) for ACO file");
			return;
		case 7: // Lab
			error("Unsupported color type (lab) for ACO file");
			return;
		case 8: // Grayscale
			error("Unsupported color type (grayscale) for ACO file");
			return;
		default:
			error("Unknown color type (%" PRIu16 ") for ACO file", colorType);
			return;
		}
	}

	// TODO: maybe scan the v2 data instead (if present)
	// `codecvt` can be used to convert from UTF-16 to UTF-8
}